

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Context *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  string *psVar7;
  MessageOptions *this_00;
  EnumDescriptor *descriptor;
  Descriptor *pDVar8;
  OneofGeneratorInfo *pOVar9;
  FieldDescriptor *pFVar10;
  ImmutableFieldLiteGenerator *pIVar11;
  int __c;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  Descriptor *descriptor_00;
  ulong uVar12;
  ulong extraout_RDX;
  FieldDescriptor *field_00;
  SubstituteArg *in_stack_fffffffffffff5e8;
  ImmutableExtensionLiteGenerator local_778;
  int local_734;
  undefined1 local_730 [4];
  int i_6;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  int local_650;
  allocator local_649;
  int i_5;
  string local_628;
  string local_608;
  string local_5e8;
  FieldDescriptor *local_5c8;
  FieldDescriptor *field_1;
  int j_1;
  string local_598;
  string local_578;
  string local_558;
  FieldDescriptor *local_538;
  FieldDescriptor *field;
  int j;
  string local_508;
  allocator local_4e1;
  key_type local_4e0;
  allocator local_4b9;
  key_type local_4b8;
  OneofDescriptor *local_498;
  OneofDescriptor *oneof;
  undefined1 local_488 [4];
  int i_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  uint local_438;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  ImmutableMessageLiteGenerator messageGenerator;
  undefined1 local_3e0 [4];
  int i_1;
  int local_38c;
  undefined1 local_388 [4];
  int i;
  SubstituteArg local_358;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  string local_1d8;
  SubstituteArg local_1b8;
  string local_188;
  string local_168 [8];
  string builder_type;
  string local_140;
  allocator local_119;
  key_type local_118;
  allocator local_f1;
  key_type local_f0;
  string local_d0;
  allocator local_a9;
  key_type local_a8;
  allocator local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  bool is_own_file;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  pcVar5 = " static ";
  if ((variables._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    pcVar5 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"static",&local_71);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_70);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  psVar7 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"classname",&local_a9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  ExtraMessageInterfaces_abi_cxx11_
            (&local_d0,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"extra_interfaces",&local_f1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_f0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string((string *)&local_d0);
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar1 = MessageOptions::deprecated(this_00);
  pcVar5 = "";
  if (bVar1) {
    pcVar5 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"deprecation",&local_119);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_118);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar8 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"",(allocator *)(builder_type.field_2._M_local_buf + 0xf));
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar8,true,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)(builder_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_168);
  iVar2 = Descriptor::extension_range_count((this->super_MessageGenerator).descriptor_);
  if (iVar2 < 1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::operator=(local_168,"com.google.protobuf.GeneratedMessageLite.Builder");
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_1d8,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b8,&local_1d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_208);
    strings::internal::SubstituteArg::SubstituteArg(&local_238);
    strings::internal::SubstituteArg::SubstituteArg(&local_268);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_328);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_388);
    strings::Substitute_abi_cxx11_
              (&local_188,
               (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
               (char *)&local_1b8,&local_208,&local_238,&local_268,&local_298,&local_2c8,&local_2f8,
               &local_328,&local_358,(SubstituteArg *)local_388,in_stack_fffffffffffff5e8);
    std::__cxx11::string::operator=(local_168,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  for (local_38c = 0; iVar2 = local_38c,
      iVar3 = Descriptor::enum_type_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3
      ; local_38c = local_38c + 1) {
    descriptor = Descriptor::enum_type((this->super_MessageGenerator).descriptor_,local_38c);
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)local_3e0,descriptor,true,this->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)local_3e0,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)local_3e0);
  }
  for (messageGenerator.field_generators_.field_generators_.array_._4_4_ = 0;
      iVar2 = messageGenerator.field_generators_.field_generators_.array_._4_4_,
      iVar3 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_),
      iVar2 < iVar3;
      messageGenerator.field_generators_.field_generators_.array_._4_4_ =
           messageGenerator.field_generators_.field_generators_.array_._4_4_ + 1) {
    pDVar8 = Descriptor::nested_type
                       ((this->super_MessageGenerator).descriptor_,
                        messageGenerator.field_generators_.field_generators_.array_._4_4_);
    bVar1 = IsMapEntry(pDVar8);
    if (!bVar1) {
      pDVar8 = Descriptor::nested_type
                         ((this->super_MessageGenerator).descriptor_,
                          messageGenerator.field_generators_.field_generators_.array_._4_4_);
      ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2,pDVar8,this->context_);
      GenerateInterface((ImmutableMessageLiteGenerator *)&i_2,printer);
      Generate((ImmutableMessageLiteGenerator *)&i_2,printer);
      ~ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&i_2);
    }
  }
  bVar1 = anon_unknown_12::GenerateHasBits((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    totalInts = 0;
    for (i_3 = 0; iVar2 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
        i_3 < iVar2; i_3 = i_3 + 1) {
      pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_3);
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,pFVar10);
      iVar2 = (*pIVar11->_vptr_ImmutableFieldLiteGenerator[2])();
      totalInts = iVar2 + totalInts;
    }
    uVar12 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
    for (local_438 = 0; (int)local_438 < (totalInts + 0x1f) / 0x20; local_438 = local_438 + 1) {
      GetBitFieldName_abi_cxx11_
                ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (java *)(ulong)local_438,(int)uVar12);
      io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar12 = extraout_RDX;
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_488);
  for (oneof._4_4_ = 0; iVar2 = oneof._4_4_,
      iVar3 = Descriptor::oneof_decl_count((this->super_MessageGenerator).descriptor_),
      iVar2 < iVar3; oneof._4_4_ = oneof._4_4_ + 1) {
    local_498 = Descriptor::oneof_decl((this->super_MessageGenerator).descriptor_,oneof._4_4_);
    pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b8,"oneof_name",&local_4b9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_488,&local_4b8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)pOVar9);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    pOVar9 = Context::GetOneofGeneratorInfo(this->context_,local_498);
    psVar7 = &pOVar9->capitalized_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e0,"oneof_capitalized_name",&local_4e1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_488,&local_4e0);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    pcVar5 = OneofDescriptor::index(local_498,(char *)psVar7,__c);
    SimpleItoa_abi_cxx11_(&local_508,(protobuf *)((ulong)pcVar5 & 0xffffffff),i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j,"oneof_index",(allocator *)((long)&field + 7));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_488,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_508);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    std::__cxx11::string::~string((string *)&local_508);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_488,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_488,
                       "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                      );
    io::Printer::Indent(printer);
    for (field._0_4_ = 0; iVar2 = (int)field, iVar3 = OneofDescriptor::field_count(local_498),
        iVar2 < iVar3; field._0_4_ = (int)field + 1) {
      local_538 = OneofDescriptor::field(local_498,(int)field);
      psVar7 = FieldDescriptor::name_abi_cxx11_(local_538);
      ToUpper(&local_558,psVar7);
      uVar4 = FieldDescriptor::number(local_538);
      SimpleItoa_abi_cxx11_(&local_578,(protobuf *)(ulong)uVar4,i_01);
      io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",&local_558,
                         "field_number",&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_558);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j_1,"oneof_name",(allocator *)((long)&field_1 + 7));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_488,(key_type *)&j_1);
    ToUpper(&local_598,pmVar6);
    io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&j_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field_1 + 7));
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_488,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_488,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    for (field_1._0_4_ = 0; iVar2 = (int)field_1, iVar3 = OneofDescriptor::field_count(local_498),
        iVar2 < iVar3; field_1._0_4_ = (int)field_1 + 1) {
      local_5c8 = OneofDescriptor::field(local_498,(int)field_1);
      uVar4 = FieldDescriptor::number(local_5c8);
      SimpleItoa_abi_cxx11_(&local_5e8,(protobuf *)(ulong)uVar4,i_02);
      psVar7 = FieldDescriptor::name_abi_cxx11_(local_5c8);
      ToUpper(&local_608,psVar7);
      io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n","field_number",
                         &local_5e8,"field_name",&local_608);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_5e8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_5,"oneof_name",&local_649);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_488,(key_type *)&i_5);
    ToUpper(&local_628,pmVar6);
    io::Printer::Print(printer,
                       "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                       ,"cap_oneof_name",&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&i_5);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n\n");
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_488,
                       "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                      );
  }
  for (local_650 = 0; iVar2 = local_650,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3;
      local_650 = local_650 + 1) {
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_650);
    FieldConstantName_abi_cxx11_(&local_670,(java *)pFVar10,field_00);
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_650);
    uVar4 = FieldDescriptor::number(pFVar10);
    SimpleItoa_abi_cxx11_(&local_690,(protobuf *)(ulong)uVar4,i_03);
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",&local_670,"number",&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_670);
    pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_650);
    pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                        (&this->field_generators_,pFVar10);
    (*pIVar11->_vptr_ImmutableFieldLiteGenerator[5])(pIVar11,printer);
    io::Printer::Print(printer,"\n");
  }
  GenerateMessageSerializationMethods(this,printer);
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar1 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_6b0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    Object arg0, Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
                     ,"classname",&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case IS_INITIALIZED: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodIsInitialized(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MAKE_IMMUTABLE: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMakeImmutable(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodNewBuilder(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase VISIT: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodVisit(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MERGE_FROM_STREAM: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMergeFromStream(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_6d0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  if (PARSER == null) {    synchronized ($classname$.class) {\n      if (PARSER == null) {\n        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n      }\n    }\n  }\n  return PARSER;\n}\n"
                     ,"classname",&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_6f0,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n","classname",
                     &local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  psVar7 = Descriptor::full_name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     psVar7);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_710,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     &local_710);
  std::__cxx11::string::~string((string *)&local_710);
  psVar7 = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "static {\n  DEFAULT_INSTANCE = new $classname$();\n  DEFAULT_INSTANCE.makeImmutable();\n}\n\n"
                     ,"classname",psVar7);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)local_730,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)local_730);
  std::__cxx11::string::~string((string *)local_730);
  GenerateParser(this,printer);
  for (local_734 = 0; iVar2 = local_734,
      iVar3 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_), iVar2 < iVar3
      ; local_734 = local_734 + 1) {
    pFVar10 = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_734);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (&local_778,pFVar10,this->context_);
    ImmutableExtensionLiteGenerator::Generate(&local_778,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&local_778);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_488);
  std::__cxx11::string::~string(local_168);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(variables,
      "$deprecation$public $static$final class $classname$ extends\n"
      "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
      "      $classname$, $classname$.Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        oneof)->capitalized_name;
    vars["oneof_index"] = SimpleItoa(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "private void clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n"
      "}\n"
      "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateMessageSerializationMethods(printer);

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }

  printer->Print(
    "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
    "protected final Object dynamicMethod(\n"
    "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
    "    Object arg0, Object arg1) {\n"
    "  switch (method) {\n"
    "    case NEW_MUTABLE_INSTANCE: {\n"
    "      return new $classname$();\n"
    "    }\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print(
    "case IS_INITIALIZED: {\n");
  printer->Indent();
  GenerateDynamicMethodIsInitialized(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MAKE_IMMUTABLE: {\n");

  printer->Indent();
  GenerateDynamicMethodMakeImmutable(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case VISIT: {\n");

  printer->Indent();
  GenerateDynamicMethodVisit(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MERGE_FROM_STREAM: {\n");

  printer->Indent();
  GenerateDynamicMethodMergeFromStream(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "// fall through\n"
    "case GET_DEFAULT_INSTANCE: {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "case GET_PARSER: {\n"
    // Generally one would use the lazy initialization holder pattern for
    // manipulating static fields but that has exceptional cost on Android as
    // it will generate an extra class for every message. Instead, use the
    // double-check locking pattern which works just as well.
    "  if (PARSER == null) {"
    "    synchronized ($classname$.class) {\n"
    "      if (PARSER == null) {\n"
    "        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n"
    "      }\n"
    "    }\n"
    "  }\n"
    "  return PARSER;\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "  throw new UnsupportedOperationException();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "  DEFAULT_INSTANCE.makeImmutable();\n"
    "}\n"
    "\n",
    "classname", descriptor_->name());
  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}